

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  buffer *this_00;
  size_t sVar5;
  element_type *peVar6;
  rpc_handler *handler;
  msg_type *args_1;
  element_type *peVar7;
  undefined4 extraout_var;
  element_type *this_01;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar9;
  ptr<req_msg> leave_req;
  peer_itor pit;
  shared_lock<std::shared_timed_mutex> rlock;
  ptr<peer> p;
  int32 srv_id;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
  *in_stack_fffffffffffffd48;
  strfmt<100> *in_stack_fffffffffffffd50;
  int *in_stack_fffffffffffffd58;
  log_entry *in_stack_fffffffffffffd60;
  unsigned_long *in_stack_fffffffffffffd68;
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  element_type *in_stack_fffffffffffffd98;
  ptr<req_msg> *in_stack_fffffffffffffdc8;
  peer *in_stack_fffffffffffffdd0;
  allocator<char> local_1b1;
  strfmt<100> local_1b0;
  string local_140 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_120;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_118;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
  local_110 [5];
  allocator<char> local_e1;
  string local_e0 [32];
  int32 local_c0;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  uint local_70;
  allocator<char> local_69;
  string local_68 [52];
  undefined4 local_34;
  ulong local_30;
  byte local_21;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *local_20;
  
  local_20 = req_msg::log_entries(in_RDX);
  local_21 = 0;
  peVar3 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d7433);
  local_30 = srv_state::get_term(peVar3);
  local_34 = 9;
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int&>
            (in_stack_fffffffffffffd68,(msg_type *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
  sVar4 = std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::size(local_20);
  if (sVar4 == 1) {
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::operator[](local_20,0);
    std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1d74aa);
    this_00 = log_entry::get_buf(in_stack_fffffffffffffd60);
    sVar5 = buffer::size(this_00);
    if (sVar5 == 4) {
      if (*(int *)(in_RSI + 0x128) == 3) {
        if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
          std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::operator[](local_20,0);
          std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d77ed);
          handler = (rpc_handler *)log_entry::get_buf(in_stack_fffffffffffffd60);
          local_c0 = buffer::get_int((buffer *)in_stack_fffffffffffffd90);
          if (local_c0 == *(int *)(in_RSI + 0xc)) {
            peVar6 = std::
                     __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d7843);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                      );
            (*peVar6->_vptr_logger[3])(peVar6,local_e0);
            std::__cxx11::string::~string(local_e0);
            std::allocator<char>::~allocator(&local_e1);
            local_21 = 1;
            local_70 = 1;
            _Var8._M_pi = extraout_RDX_02;
          }
          else {
            std::shared_ptr<cornerstone::peer>::shared_ptr
                      ((shared_ptr<cornerstone::peer> *)0x1d7915);
            std::shared_lock<std::shared_timed_mutex>::shared_lock
                      ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffd50,
                       (mutex_type *)in_stack_fffffffffffffd48);
            local_118._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                 ::find(in_stack_fffffffffffffd48,(key_type *)0x1d794c);
            std::__detail::
            _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
            ::_Node_const_iterator
                      ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                        *)in_stack_fffffffffffffd50,
                       (_Node_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                        *)in_stack_fffffffffffffd48);
            local_120._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                 ::end(in_stack_fffffffffffffd48);
            bVar1 = std::__detail::operator==(local_110,&local_120);
            if (bVar1) {
              in_stack_fffffffffffffd98 =
                   std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d79c3);
              iVar2 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
              strfmt<100>::strfmt(&local_1b0,"server %d does not exist");
              in_stack_fffffffffffffd90 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   strfmt<100>::fmt<int>(in_stack_fffffffffffffd50,iVar2);
              __s = &local_1b1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffd90,(char *)__s,in_stack_fffffffffffffd80);
              (*in_stack_fffffffffffffd98->_vptr_logger[3])(in_stack_fffffffffffffd98,local_140);
              std::__cxx11::string::~string(local_140);
              std::allocator<char>::~allocator(&local_1b1);
              local_21 = 1;
            }
            else {
              std::__detail::
              _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
              ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                            *)0x1d7af6);
              std::shared_ptr<cornerstone::peer>::operator=
                        ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffffd50,
                         (shared_ptr<cornerstone::peer> *)in_stack_fffffffffffffd48);
            }
            local_70 = (uint)bVar1;
            std::shared_lock<std::shared_timed_mutex>::~shared_lock
                      ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffd50);
            if (local_70 == 0) {
              peVar3 = std::
                       __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1d7b47);
              srv_state::get_term(peVar3);
              args_1 = (msg_type *)(in_RSI + 0xc);
              peVar7 = std::
                       __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1d7b99);
              iVar2 = (*peVar7->_vptr_log_store[2])();
              cs_new<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int&,int&,int,unsigned_long,unsigned_long&>
                        ((unsigned_long *)CONCAT44(extraout_var,iVar2),args_1,
                         (int *)in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                         in_stack_fffffffffffffd58,(unsigned_long *)in_stack_fffffffffffffd90,
                         (unsigned_long *)in_stack_fffffffffffffd98);
              std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d7c1b);
              peer::send_req(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,handler);
              this_01 = std::
                        __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1d7c49);
              peVar7 = std::
                       __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1d7c62);
              iVar2 = (*peVar7->_vptr_log_store[2])();
              resp_msg::accept(this_01,iVar2,__addr,args_1);
              local_21 = 1;
              local_70 = 1;
              std::shared_ptr<cornerstone::req_msg>::~shared_ptr
                        ((shared_ptr<cornerstone::req_msg> *)0x1d7ca6);
            }
            std::shared_ptr<cornerstone::peer>::~shared_ptr
                      ((shared_ptr<cornerstone::peer> *)0x1d7ce7);
            _Var8._M_pi = extraout_RDX_03;
          }
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d7703);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
          (*peVar6->_vptr_logger[3])(peVar6,local_b8);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator(&local_b9);
          local_21 = 1;
          local_70 = 1;
          _Var8._M_pi = extraout_RDX_01;
        }
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d760c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        (*peVar6->_vptr_logger[3])(peVar6,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        local_21 = 1;
        local_70 = 1;
        _Var8._M_pi = extraout_RDX_00;
      }
      goto LAB_001d7cf8;
    }
  }
  peVar6 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d74f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  (*peVar6->_vptr_logger[3])(peVar6,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  local_21 = 1;
  local_70 = 1;
  _Var8._M_pi = extraout_RDX;
LAB_001d7cf8:
  if ((local_21 & 1) == 0) {
    std::shared_ptr<cornerstone::resp_msg>::~shared_ptr
              ((shared_ptr<cornerstone::resp_msg> *)0x1d7d0f);
    _Var8._M_pi = extraout_RDX_04;
  }
  pVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::remove_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int)
    {
        l_->info("bad remove server request as we are expecting one log entry with value type of int");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle RemoveServerRequest");
        return resp;
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_)
    {
        l_->info("cannot request to remove leader");
        return resp;
    }

    ptr<peer> p;
    {
        read_lock(peers_lock_);
        peer_itor pit = peers_.find(srv_id);
        if (pit == peers_.end())
        {
            l_->info(sstrfmt("server %d does not exist").fmt(srv_id));
            return resp;
        }

        p = pit->second;
    }

    ptr<req_msg> leave_req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::leave_cluster_request,
        id_,
        srv_id,
        0,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    p->send_req(leave_req, ex_resp_handler_);
    resp->accept(log_store_->next_slot());
    return resp;
}